

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O2

Trampoline * __thiscall
LambdaMeaning::Eval(Trampoline *__return_storage_ptr__,LambdaMeaning *this,Sexp *act)

{
  Sexp *pSVar1;
  Sexp *local_40;
  Sexp *act_local;
  ContractFrameProtector __contract_frame;
  FrameProtector __frame_prot;
  
  local_40 = act;
  ContractFrameProtector::ContractFrameProtector((ContractFrameProtector *)&act_local,"Eval");
  ContractFrame::CheckPrecondition
            ((ContractFrame *)act_local,act->kind == ACTIVATION,"act->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&__contract_frame,"Eval");
  FrameProtector::ProtectValue((FrameProtector *)&__contract_frame,&local_40,"act");
  pSVar1 = GcHeap::AllocateFunction(this,local_40);
  __return_storage_ptr__->kind = Value;
  (__return_storage_ptr__->field_1).value = pSVar1;
  FrameProtector::~FrameProtector((FrameProtector *)&__contract_frame);
  ContractFrameProtector::~ContractFrameProtector((ContractFrameProtector *)&act_local);
  return __return_storage_ptr__;
}

Assistant:

Trampoline LambdaMeaning::Eval(Sexp *act) {
  CONTRACT { PRECONDITION(act->IsActivation()); }